

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

char * Jinx::Impl::GetUtf8CstrByIndex(String *source,int64_t index)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  char *utf8Str;
  bool bVar4;
  
  utf8Str = (source->_M_dataplus)._M_p;
  if (0 < (long)source->_M_string_length) {
    pcVar2 = utf8Str + source->_M_string_length;
    uVar3 = 0;
    do {
      sVar1 = GetUtf8CharSize(utf8Str);
      utf8Str = utf8Str + sVar1;
      uVar3 = uVar3 + 1;
    } while (utf8Str < pcVar2);
    utf8Str = (source->_M_dataplus)._M_p;
    if (index - 1U < uVar3) {
      if ((ulong)index < 2 || (long)source->_M_string_length < 1) {
        return utf8Str;
      }
      pcVar2 = utf8Str + source->_M_string_length;
      uVar3 = 2;
      do {
        sVar1 = GetUtf8CharSize(utf8Str);
        utf8Str = utf8Str + sVar1;
        if (pcVar2 <= utf8Str) {
          return utf8Str;
        }
        bVar4 = uVar3 < (ulong)index;
        uVar3 = uVar3 + 1;
      } while (bVar4);
      return utf8Str;
    }
  }
  LogWriteLine(Error,"Attempted to access string %s with out of bounds index %zu",utf8Str,index);
  return (char *)0x0;
}

Assistant:

inline_t const char * GetUtf8CstrByIndex(const String & source, int64_t index)
	{
		size_t idx = static_cast<size_t>(index);
		if (idx > GetStringCount(source) || idx < 1)
		{
			LogWriteLine(LogLevel::Error, "Attempted to access string %s with out of bounds index %zu", source.c_str(), idx);
			return nullptr;
		}
		const char * cstr = source.c_str();
		const char * end = cstr + source.size();
		size_t i = 1;
		while (cstr < end && i < idx)
		{
			cstr += GetUtf8CharSize(cstr);
			++i;
		}
		return cstr;
	}